

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O3

bool __thiscall net_uv::TCPSocket::bind6(TCPSocket *this,char *ip,uint32_t port)

{
  int iVar1;
  uv_tcp_t *puVar2;
  bool bVar3;
  sockaddr_in6 bind_addr;
  allocator<char> local_41;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,ip,&local_41);
  std::__cxx11::string::_M_assign((string *)&(this->super_Socket).m_ip);
  if (local_40[0] != (undefined1 *)((long)&((sockaddr_in6 *)local_40)->sin6_addr + 8U)) {
    operator_delete(local_40[0],local_30._0_8_ + 1);
  }
  (this->super_Socket).m_port = port;
  iVar1 = uv_ip6_addr(ip,port,(sockaddr_in6 *)local_40);
  if (iVar1 == 0) {
    puVar2 = this->m_tcp;
    if (puVar2 == (uv_tcp_t *)0x0) {
      puVar2 = (uv_tcp_t *)malloc(0xf8);
      this->m_tcp = puVar2;
      uv_tcp_init((this->super_Socket).m_loop,puVar2);
      puVar2 = this->m_tcp;
      puVar2->data = this;
    }
    iVar1 = uv_tcp_bind(puVar2,(sockaddr *)local_40,0);
    bVar3 = iVar1 == 0;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool TCPSocket::bind6(const char* ip, uint32_t port)
{
	this->setIp(ip);
	this->setPort(port);

	struct sockaddr_in6 bind_addr;
	int32_t r = uv_ip6_addr(ip, port, &bind_addr);
	if (r != 0)
	{
		return false;
	}

	if (m_tcp == NULL)
	{
		m_tcp = (uv_tcp_t*)fc_malloc(sizeof(uv_tcp_t));
		int32_t r = uv_tcp_init(m_loop, m_tcp);
		CHECK_UV_ASSERT(r);

		m_tcp->data = this;
	}

	r = uv_tcp_bind(m_tcp, (const struct sockaddr*) &bind_addr, 0);

	return (r == 0);
}